

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBodyConcaveCollisionAlgorithm.cpp
# Opt level: O2

void __thiscall
btSoftBodyConcaveCollisionAlgorithm::processCollision
          (btSoftBodyConcaveCollisionAlgorithm *this,btCollisionObjectWrapper *body0Wrap,
          btCollisionObjectWrapper *body1Wrap,btDispatcherInfo *dispatchInfo,
          btManifoldResult *resultOut)

{
  btCollisionShape *pbVar1;
  btScalar collisionMarginTriangle;
  
  if (this->m_isSwapped == false) {
    body0Wrap = body1Wrap;
  }
  if (body0Wrap->m_shape->m_shapeType - 0x15U < 9) {
    pbVar1 = body0Wrap->m_collisionObject->m_collisionShape;
    (*pbVar1->_vptr_btCollisionShape[0xc])(pbVar1);
    btSoftBodyTriangleCallback::setTimeStepAndCounters
              (&this->m_btSoftBodyTriangleCallback,collisionMarginTriangle,body0Wrap,dispatchInfo,
               resultOut);
    (*pbVar1->_vptr_btCollisionShape[0x10])
              (pbVar1,&this->m_btSoftBodyTriangleCallback,
               &(this->m_btSoftBodyTriangleCallback).m_aabbMin,
               &(this->m_btSoftBodyTriangleCallback).m_aabbMax);
    return;
  }
  return;
}

Assistant:

void btSoftBodyConcaveCollisionAlgorithm::processCollision (const btCollisionObjectWrapper* body0Wrap,const btCollisionObjectWrapper* body1Wrap,const btDispatcherInfo& dispatchInfo,btManifoldResult* resultOut)
{


	//btCollisionObject* convexBody = m_isSwapped ? body1 : body0;
	const btCollisionObjectWrapper* triBody = m_isSwapped ? body0Wrap : body1Wrap;

	if (triBody->getCollisionShape()->isConcave())
	{


		const btCollisionObject*	triOb = triBody->getCollisionObject();
		const btConcaveShape* concaveShape = static_cast<const btConcaveShape*>( triOb->getCollisionShape());

		//	if (convexBody->getCollisionShape()->isConvex())
		{
			btScalar collisionMarginTriangle = concaveShape->getMargin();

			//			resultOut->setPersistentManifold(m_btSoftBodyTriangleCallback.m_manifoldPtr);
			m_btSoftBodyTriangleCallback.setTimeStepAndCounters(collisionMarginTriangle,triBody,dispatchInfo,resultOut);

		
			concaveShape->processAllTriangles( &m_btSoftBodyTriangleCallback,m_btSoftBodyTriangleCallback.getAabbMin(),m_btSoftBodyTriangleCallback.getAabbMax());

			//	resultOut->refreshContactPoints();

		}

	}

}